

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O1

void __thiscall
PersistentStorageJsonTestSuite_GetRegistrarNotEmpty_Test::TestBody
          (PersistentStorageJsonTestSuite_GetRegistrarNotEmpty_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  pointer pbVar7;
  size_type sVar8;
  Status SVar9;
  int iVar10;
  char *in_R9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar__12;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar_;
  RegistrarId newId;
  Registrar returnValue;
  PersistentStorageJson psj;
  allocator_type local_121;
  AssertHelper local_120;
  undefined8 *local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  RegistrarId local_b8;
  RegistrarId local_b4;
  Registrar local_b0;
  PersistentStorageJson local_68;
  
  unlink("./tmp/test.tmp");
  lVar4 = (long)&local_b0 + 0x10;
  local_b0._0_8_ = lVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"./tmp/test.tmp","");
  ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
            (&local_68,(string *)&local_b0);
  if (local_b0._0_8_ != lVar4) {
    operator_delete((void *)local_b0._0_8_);
  }
  SVar9 = ot::commissioner::persistent_storage::PersistentStorageJson::Open(&local_68);
  local_d8._M_dataplus._M_p._0_1_ = SVar9 == kSuccess;
  local_d8._M_string_length = 0;
  if (SVar9 != kSuccess) {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_d8,
               (AssertionResult *)"psj.Open() == PersistentStorage::Status::kSuccess","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,299,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_b0._0_8_ != lVar4) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((long *)local_f8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_f8._M_dataplus._M_p + 8))();
    }
  }
  sVar8 = local_d8._M_string_length;
  if ((undefined8 *)local_d8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_d8._M_string_length !=
        (undefined8 *)(local_d8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_d8._M_string_length);
    }
    operator_delete((void *)sVar8);
  }
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId(&local_b8);
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId(&local_b4,0xffffffff);
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"0.0.0.1","");
  paVar2 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"dom1","");
  __l._M_len = 1;
  __l._M_array = &local_f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110,__l,&local_121);
  ot::commissioner::persistent_storage::Registrar::Registrar
            (&local_b0,&local_b4,&local_d8,1,&local_110);
  SVar9 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    (&local_68,&local_b0,&local_b8);
  local_120.data_._0_1_ = (internal)(SVar9 == kSuccess);
  local_118 = (undefined8 *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.mDomains);
  lVar5 = (long)&local_b0 + 0x18;
  if (local_b0.mAddr._M_dataplus._M_p != (pointer)lVar5) {
    operator_delete(local_b0.mAddr._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_120.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_120,
               (AssertionResult *)
               "psj.Add(Registrar{EMPTY_ID, \"0.0.0.1\", 1, {\"dom1\"}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x12f,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_b0._0_8_ != lVar4) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  puVar6 = local_118;
  if (local_118 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_118 != local_118 + 2) {
      operator_delete((undefined8 *)*local_118);
    }
    operator_delete(puVar6);
  }
  local_d8._M_dataplus._M_p._0_1_ = local_b8.mId == 0;
  local_d8._M_string_length = 0;
  if (local_b8.mId != 0) {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_d8,(AssertionResult *)"newId.mId == 0","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x130,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_b0._0_8_ != lVar4) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 8))();
    }
  }
  sVar8 = local_d8._M_string_length;
  if ((undefined8 *)local_d8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_d8._M_string_length !=
        (undefined8 *)(local_d8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_d8._M_string_length);
    }
    operator_delete((void *)sVar8);
  }
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId(&local_b4,0xffffffff);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"0.0.0.2","");
  local_f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"dom2","");
  __l_00._M_len = 1;
  __l_00._M_array = &local_f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110,__l_00,&local_121);
  ot::commissioner::persistent_storage::Registrar::Registrar
            (&local_b0,&local_b4,&local_d8,2,&local_110);
  SVar9 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    (&local_68,&local_b0,&local_b8);
  local_120.data_._0_1_ = (internal)(SVar9 == kSuccess);
  local_118 = (undefined8 *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.mDomains);
  if (local_b0.mAddr._M_dataplus._M_p != (pointer)lVar5) {
    operator_delete(local_b0.mAddr._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_120.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_120,
               (AssertionResult *)
               "psj.Add(Registrar{EMPTY_ID, \"0.0.0.2\", 2, {\"dom2\"}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x131,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_b0._0_8_ != lVar4) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  puVar6 = local_118;
  if (local_118 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_118 != local_118 + 2) {
      operator_delete((undefined8 *)*local_118);
    }
    operator_delete(puVar6);
  }
  local_d8._M_dataplus._M_p._0_1_ = local_b8.mId == 1;
  local_d8._M_string_length = 0;
  if (local_b8.mId != 1) {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_d8,(AssertionResult *)"newId.mId == 1","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x132,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_b0._0_8_ != lVar4) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 8))();
    }
  }
  sVar8 = local_d8._M_string_length;
  if ((undefined8 *)local_d8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_d8._M_string_length !=
        (undefined8 *)(local_d8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_d8._M_string_length);
    }
    operator_delete((void *)sVar8);
  }
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId(&local_b4,0xffffffff);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"0.0.0.3","");
  local_f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"dom3","");
  __l_01._M_len = 1;
  __l_01._M_array = &local_f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110,__l_01,&local_121);
  ot::commissioner::persistent_storage::Registrar::Registrar
            (&local_b0,&local_b4,&local_d8,3,&local_110);
  SVar9 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                    (&local_68,&local_b0,&local_b8);
  local_120.data_._0_1_ = (internal)(SVar9 == kSuccess);
  local_118 = (undefined8 *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.mDomains);
  if (local_b0.mAddr._M_dataplus._M_p != (pointer)lVar5) {
    operator_delete(local_b0.mAddr._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_120.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_120,
               (AssertionResult *)
               "psj.Add(Registrar{EMPTY_ID, \"0.0.0.3\", 3, {\"dom3\"}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x133,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_b0._0_8_ != lVar4) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
    }
  }
  puVar6 = local_118;
  if (local_118 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_118 != local_118 + 2) {
      operator_delete((undefined8 *)*local_118);
    }
    operator_delete(puVar6);
  }
  local_d8._M_dataplus._M_p._0_1_ = local_b8.mId == 2;
  local_d8._M_string_length = 0;
  if (local_b8.mId != 2) {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_d8,(AssertionResult *)"newId.mId == 2","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x134,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_b0._0_8_ != lVar4) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 8))();
    }
  }
  sVar8 = local_d8._M_string_length;
  if ((undefined8 *)local_d8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_d8._M_string_length !=
        (undefined8 *)(local_d8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_d8._M_string_length);
    }
    operator_delete((void *)sVar8);
  }
  ot::commissioner::persistent_storage::Registrar::Registrar(&local_b0);
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId((RegistrarId *)&local_d8,3);
  SVar9 = ot::commissioner::persistent_storage::PersistentStorageJson::Get
                    (&local_68,(RegistrarId *)&local_d8,&local_b0);
  local_f8._M_dataplus._M_p._0_1_ = SVar9 == kNotFound;
  local_f8._M_string_length = 0;
  if (SVar9 != kNotFound) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)&local_f8,
               (AssertionResult *)
               "psj.Get(RegistrarId(3), returnValue) == PersistentStorage::Status::kNotFound",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x138,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_110.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_110.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  sVar8 = local_f8._M_string_length;
  if ((undefined8 *)local_f8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_f8._M_string_length !=
        (undefined8 *)(local_f8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_f8._M_string_length);
    }
    operator_delete((void *)sVar8);
  }
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId((RegistrarId *)&local_d8,1);
  SVar9 = ot::commissioner::persistent_storage::PersistentStorageJson::Get
                    (&local_68,(RegistrarId *)&local_d8,&local_b0);
  local_f8._M_dataplus._M_p._0_1_ = SVar9 == kSuccess;
  local_f8._M_string_length = 0;
  if (SVar9 != kSuccess) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)&local_f8,
               (AssertionResult *)
               "psj.Get(RegistrarId(1), returnValue) == PersistentStorage::Status::kSuccess","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x139,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_110.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_110.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  sVar8 = local_f8._M_string_length;
  if ((undefined8 *)local_f8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_f8._M_string_length !=
        (undefined8 *)(local_f8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_f8._M_string_length);
    }
    operator_delete((void *)sVar8);
  }
  local_f8._M_dataplus._M_p._0_1_ = local_b0.mId.mId == 1;
  local_f8._M_string_length = 0;
  if (local_b0.mId.mId != 1) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)&local_f8,(AssertionResult *)"returnValue.mId.mId == 1","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x13a,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_110.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_110.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  sVar8 = local_f8._M_string_length;
  if ((undefined8 *)local_f8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_f8._M_string_length !=
        (undefined8 *)(local_f8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_f8._M_string_length);
    }
    operator_delete((void *)sVar8);
  }
  iVar10 = std::__cxx11::string::compare((char *)((long)&local_b0 + 8));
  local_f8._M_dataplus._M_p._0_1_ = iVar10 == 0;
  local_f8._M_string_length = 0;
  if (iVar10 != 0) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)&local_f8,(AssertionResult *)"returnValue.mAddr == \"0.0.0.2\""
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x13b,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_110.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_110.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  sVar8 = local_f8._M_string_length;
  if ((undefined8 *)local_f8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_f8._M_string_length !=
        (undefined8 *)(local_f8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_f8._M_string_length);
    }
    operator_delete((void *)sVar8);
  }
  local_f8._M_dataplus._M_p._0_1_ = local_b0.mPort == 2;
  local_f8._M_string_length = 0;
  if (local_b0.mPort != 2) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)&local_f8,(AssertionResult *)"returnValue.mPort == 2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x13c,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_110.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_110.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  sVar8 = local_f8._M_string_length;
  if ((undefined8 *)local_f8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_f8._M_string_length !=
        (undefined8 *)(local_f8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_f8._M_string_length);
    }
    operator_delete((void *)sVar8);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"dom2","");
  __l_02._M_len = 1;
  __l_02._M_array = &local_d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_f8,__l_02,(allocator_type *)&local_120);
  if ((long)local_b0.mDomains.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_b0.mDomains.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      local_f8._M_string_length - (long)local_f8._M_dataplus._M_p) {
    local_110.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ =
         (internal)
         std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                   (local_b0.mDomains.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    local_b0.mDomains.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_f8._M_dataplus._M_p);
  }
  else {
    local_110.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)0x0;
  }
  local_110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)&local_110,
               (AssertionResult *)"returnValue.mDomains == std::vector<std::string>{\"dom2\"}",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x13d,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_f8._M_dataplus._M_p !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_dataplus._M_p + 8))();
    }
  }
  pbVar7 = local_110.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    pcVar3 = ((local_110.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 !=
        &(local_110.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->field_2) {
      operator_delete(pcVar3);
    }
    operator_delete(pbVar7);
  }
  SVar9 = ot::commissioner::persistent_storage::PersistentStorageJson::Close(&local_68);
  local_f8._M_dataplus._M_p._0_1_ = SVar9 == kSuccess;
  local_f8._M_string_length = 0;
  if (SVar9 != kSuccess) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)&local_f8,
               (AssertionResult *)"psj.Close() == PersistentStorage::Status::kSuccess","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x13f,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_110.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_110.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  sVar8 = local_f8._M_string_length;
  if ((undefined8 *)local_f8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_f8._M_string_length !=
        (undefined8 *)(local_f8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_f8._M_string_length);
    }
    operator_delete((void *)sVar8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.mDomains);
  if (local_b0.mAddr._M_dataplus._M_p != (pointer)lVar5) {
    operator_delete(local_b0.mAddr._M_dataplus._M_p);
  }
  ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson(&local_68);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, GetRegistrarNotEmpty)
{
    // Make test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    RegistrarId newId;

    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.1", 1, {"dom1"}}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 0);
    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.2", 2, {"dom2"}}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 1);
    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.3", 3, {"dom3"}}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 2);

    Registrar returnValue;

    EXPECT_TRUE(psj.Get(RegistrarId(3), returnValue) == PersistentStorage::Status::kNotFound);
    EXPECT_TRUE(psj.Get(RegistrarId(1), returnValue) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(returnValue.mId.mId == 1);
    EXPECT_TRUE(returnValue.mAddr == "0.0.0.2");
    EXPECT_TRUE(returnValue.mPort == 2);
    EXPECT_TRUE(returnValue.mDomains == std::vector<std::string>{"dom2"});

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}